

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::getInfo1
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo1 *info)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  bool *pbVar5;
  
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  info->m_numConstraintRows = 0;
  info->nub = 0;
  iVar2 = 0;
  lVar3 = 0x330;
  do {
    iVar1 = *(int *)((long)this + lVar3 * 4 + -0x8ec);
    if (iVar1 != 0) {
      iVar4 = 2;
      if (iVar1 != 4) {
        iVar4 = 1;
      }
      iVar2 = iVar2 + iVar4;
      info->m_numConstraintRows = iVar2;
    }
    if (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x48) == '\x01') {
      iVar2 = iVar2 + 1;
      info->m_numConstraintRows = iVar2;
    }
    if (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x42) == '\x01') {
      iVar2 = iVar2 + 1;
      info->m_numConstraintRows = iVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x333);
  pbVar5 = &this->m_angularLimits[0].m_enableMotor;
  lVar3 = 0;
  do {
    testAngularLimitMotor(this,(int)lVar3);
    if (*(int *)(pbVar5 + 0x38) != 0) {
      iVar2 = 2;
      if (*(int *)(pbVar5 + 0x38) != 4) {
        iVar2 = 1;
      }
      info->m_numConstraintRows = info->m_numConstraintRows + iVar2;
    }
    if (*pbVar5 == true) {
      info->m_numConstraintRows = info->m_numConstraintRows + 1;
    }
    if (pbVar5[0x14] == true) {
      info->m_numConstraintRows = info->m_numConstraintRows + 1;
    }
    lVar3 = lVar3 + 1;
    pbVar5 = pbVar5 + 0x58;
  } while (lVar3 != 3);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::getInfo1 (btConstraintInfo1* info)
{
	//prepare constraint
	calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
	info->m_numConstraintRows = 0;
	info->nub = 0;
	int i;
	//test linear limits
	for(i = 0; i < 3; i++)
	{
		     if (m_linearLimits.m_currentLimit[i]==4) info->m_numConstraintRows += 2;
		else if (m_linearLimits.m_currentLimit[i]!=0) info->m_numConstraintRows += 1;
		if (m_linearLimits.m_enableMotor[i] ) info->m_numConstraintRows += 1;
		if (m_linearLimits.m_enableSpring[i]) info->m_numConstraintRows += 1;
	}
	//test angular limits
	for (i=0;i<3 ;i++ )
	{
		testAngularLimitMotor(i);
		     if (m_angularLimits[i].m_currentLimit==4) info->m_numConstraintRows += 2;
		else if (m_angularLimits[i].m_currentLimit!=0) info->m_numConstraintRows += 1;
		if (m_angularLimits[i].m_enableMotor ) info->m_numConstraintRows += 1;
		if (m_angularLimits[i].m_enableSpring) info->m_numConstraintRows += 1;
	}
}